

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::compiler::java::(anonymous_namespace)::SetPrimitiveVariables(google::protobuf::FieldDescriptor_const*,int,int,google::protobuf::compiler::java::FieldGeneratorInfo_const*,google::protobuf::compiler::java::ClassNameResolver*,absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>*,google::protobuf::compiler::java::Context*)::__3,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr,type args)

{
  anon_class_8_1_10ae0417 *o;
  type args_local;
  VoidPtr ptr_local;
  
  args_local._M_len = args._M_len;
  o = (anon_class_8_1_10ae0417 *)ptr;
  args_local._M_str = (char *)this;
  std::
  invoke_abi_cxx11_<google::protobuf::compiler::java::(anonymous_namespace)::SetPrimitiveVariables(google::protobuf::FieldDescriptor_const*,int,int,google::protobuf::compiler::java::FieldGeneratorInfo_const*,google::protobuf::compiler::java::ClassNameResolver*,absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>*,google::protobuf::compiler::java::Context*)::__3_const&,std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,(anon_class_8_1_10ae0417 *)this,
             (basic_string_view<char,_std::char_traits<char>_> *)&o);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}